

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

int lgx_type_cmp(lgx_type_t *t1,lgx_type_t *t2)

{
  lgx_val_type_t lVar1;
  lgx_type_struct_s *t1_00;
  lgx_type_struct_s *t2_00;
  int iVar2;
  
  while( true ) {
    while( true ) {
      lVar1 = t1->type;
      if (lVar1 != t2->type) {
        return 1;
      }
      if (lVar1 != T_ARRAY) break;
      t1 = &((t1->u).arr)->value;
      t2 = &((t2->u).arr)->value;
    }
    if (lVar1 != T_MAP) break;
    t1_00 = (t1->u).sru;
    t2_00 = (t2->u).sru;
    iVar2 = lgx_type_cmp((lgx_type_t *)t1_00,(lgx_type_t *)t2_00);
    if (iVar2 != 0) {
      return 1;
    }
    t1 = (lgx_type_t *)&t1_00->methods;
    t2 = (lgx_type_t *)&t2_00->methods;
  }
  if (lVar1 == T_UNKNOWN) {
    return 1;
  }
  if (lVar1 != T_FUNCTION) {
    return 0;
  }
  iVar2 = lgx_type_cmp_function
                    ((lgx_type_function_t *)(t1->u).arr,(lgx_type_function_t *)(t2->u).arr);
  return iVar2;
}

Assistant:

int lgx_type_cmp(lgx_type_t* t1, lgx_type_t* t2) {
    if (t1->type != t2->type) {
        return 1;
    }

    switch (t1->type) {
        case T_UNKNOWN:
            // unknown != unknown
            return 1;
        case T_ARRAY:
            return lgx_type_cmp(&t1->u.arr->value, &t2->u.arr->value);
        case T_MAP:
            if (lgx_type_cmp(&t1->u.map->key, &t2->u.map->key)) {
                return 1;
            }
            return lgx_type_cmp(&t1->u.map->value, &t2->u.map->value);
        case T_STRUCT:
            // TODO
            break;
        case T_INTERFACE:
            // TODO
            break;
        case T_FUNCTION:
            return lgx_type_cmp_function(t1->u.fun, t2->u.fun);
        default:
            break;
    }

    return 0;
}